

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall GT7VolumeFile::parseHeader(GT7VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  uint64_t *puVar1;
  pointer puVar2;
  pointer pSVar3;
  pointer puVar4;
  pointer puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  pointer pVVar9;
  uint32_t seed;
  pointer __dest;
  GT7VolumeFile *pGVar10;
  GT7VolumeFile *this_00;
  uint uVar11;
  uint uVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  path *local_90;
  GT7VolumeFile *local_88;
  vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *local_80;
  pointer local_78;
  string local_70 [32];
  string local_50 [32];
  
  if ((this->super_VolumeFile).m_swapEndian == true) {
    if (*(int *)header != 0x6251745b) {
      return false;
    }
    seed = swap_bytes(*(undefined4 *)(header + 0xf0));
    uVar11 = swap_bytes(*(undefined4 *)(header + 0xf4));
    uVar12 = swap_bytes(*(undefined4 *)(header + 0xf8));
    uVar8 = swap_bytes(*(undefined4 *)(header + 0xfc));
  }
  else {
    if (*(int *)header != 0x5b745162) {
      return false;
    }
    seed = *(uint32_t *)(header + 0xf0);
    uVar11 = *(uint *)(header + 0xf4);
    uVar12 = *(uint *)(header + 0xf8);
    uVar8 = *(uint *)(header + 0xfc);
  }
  std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::resize
            (&this->m_volumes,(ulong)uVar8);
  pVVar9 = (this->m_volumes).
           super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __dest = (this->m_volumes).
           super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)pVVar9 - (long)__dest != 0) {
    memmove(__dest,header + 0x100,(long)pVVar9 - (long)__dest);
    __dest = (this->m_volumes).
             super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar9 = (this->m_volumes).
             super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; __dest != pVVar9; __dest = __dest + 1) {
    puVar1 = &__dest->fileSize;
    *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
  }
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar6 = VolumeFile::readDataAt
                    (&this->super_VolumeFile,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,0x800,
                     (ulong)uVar11);
  if (bVar6) {
    pGVar10 = this;
    VolumeFile::decryptData
              (&this->super_VolumeFile,local_a8._M_impl.super__Vector_impl_data._M_start,
               (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8._M_impl.super__Vector_impl_data._M_start,seed);
    bVar6 = VolumeFile::inflateDataIfNeeded
                      (&pGVar10->super_VolumeFile,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
                       (ulong)uVar12);
    if (bVar6) {
      (this->super_VolumeFile).m_dataOffset = 0;
      local_80 = &(this->super_VolumeFile).m_dataStreams;
      puVar4 = (this->super_VolumeFile).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this->super_VolumeFile).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar2 = (this->super_VolumeFile).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->super_VolumeFile).m_data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_a8._M_impl.super__Vector_impl_data._M_start;
      (this->super_VolumeFile).m_data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = local_a8._M_impl.super__Vector_impl_data._M_finish;
      (this->super_VolumeFile).m_data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_90 = &(this->super_VolumeFile).m_basePath;
      local_78 = (this->m_volumes).
                 super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pVVar9 = (this->m_volumes).
               super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8._M_impl.super__Vector_impl_data._M_start = puVar4;
      local_a8._M_impl.super__Vector_impl_data._M_finish = puVar5;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
      local_88 = this;
      do {
        bVar6 = pVVar9 == local_78;
        if (bVar6) break;
        std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::emplace_back<>
                  (local_80);
        pSVar3 = (local_88->super_VolumeFile).m_dataStreams.
                 super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        boost::filesystem::path::path((path *)local_70,pVVar9->fileName);
        boost::filesystem::operator/((path *)local_50,local_90,(path *)local_70);
        std::__cxx11::string::_M_assign((string *)&pSVar3[-1].filePath);
        pGVar10 = (GT7VolumeFile *)(pSVar3 + -1);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string(local_70);
        this_00 = pGVar10;
        bVar7 = prepareStream((ifstream *)pGVar10,&pSVar3[-1].filePath,&pSVar3[-1].fileSize);
        if (!bVar7) break;
        bVar7 = parseExtendedHeader(this_00,(StreamDesc *)pGVar10);
        pVVar9 = pVVar9 + 1;
      } while (bVar7);
      goto LAB_0011c8f0;
    }
  }
  bVar6 = false;
LAB_0011c8f0:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  return bVar6;
}

Assistant:

bool GT7VolumeFile::parseHeader(const uint8_t* header, uint64_t headerSize)
{
	const auto* p = header;

	const auto headerSizeAligned = SEGMENT_SIZE;

	const auto magic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (magic != HEADER_MAGIC) {
		return false;
	}

	// TODO: figure out what are these fields
	const auto hdr_0x1CC = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x04
	const auto hdr_0x1D0 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x08
	const auto hdr_0x1D4 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x0C
	const auto hdr_0x1D8 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x10

	advancePointerInplace(p, 0xDC);

	const auto seed = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto zDataSize = VOLUME_READ_NEXT_SELF(p, uint32_t); // with header
	const auto dataSize = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto volumeCount = VOLUME_READ_NEXT_SELF(p, uint32_t);

	m_volumes.resize(volumeCount);
	std::copy_n(reinterpret_cast<const VolumeInfo*>(p), m_volumes.size(), m_volumes.begin());
	for (auto& volumeInfo: m_volumes) {
		volumeInfo.fileSize = (volumeInfo.fileSize >> 32) | ((volumeInfo.fileSize & 0xFFFFFFFF) << 32);
	}

	std::vector<uint8_t> data;
	if (!readDataAt(data, headerSizeAligned, zDataSize)) {
		return false;
	}
	decryptData(data.data(), data.size(), seed);
	if (!inflateDataIfNeeded(data, dataSize)) {
		return false;
	}

	m_dataOffset = 0;
	m_data.swap(data);

	for (auto& volumeInfo: m_volumes) {
		m_dataStreams.emplace_back();
		auto& streamDesc = m_dataStreams.back();
		{
			streamDesc.filePath = (m_basePath / volumeInfo.fileName).string();
			if (!prepareStream(streamDesc.stream, streamDesc.filePath, &streamDesc.fileSize)) {
				return false;
			}
			if (!parseExtendedHeader(streamDesc)) {
				return false;
			}
		}
	}

	return true;
}